

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle.cpp
# Opt level: O2

void __thiscall particle::collideBox(particle *this,vec2f *box,float *r)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = (this->position).x;
  fVar2 = (this->velocity).x;
  fVar3 = *r;
  if (((fVar1 < fVar3) && (fVar2 < 0.0)) || ((box->x - fVar3 < fVar1 && (0.0 < fVar2)))) {
    (this->velocity).x = -fVar2;
    fVar3 = *r;
  }
  fVar1 = (this->position).y;
  fVar2 = (this->velocity).y;
  if (((fVar1 < fVar3) && (fVar2 < 0.0)) || ((box->y - fVar3 < fVar1 && (0.0 < fVar2)))) {
    (this->velocity).y = -fVar2;
  }
  return;
}

Assistant:

void particle::collideBox(const vec2f& box, const float& r)
{
    if((position.getX() < 0 + r && velocity.getX() < 0)
       || (position.getX() > box.getX() - r && velocity.getX() > 0))
        velocity.setX(-velocity.getX());
    if((position.getY() < 0 + r && velocity.getY() < 0)
       || (position.getY() > box.getY() - r && velocity.getY() > 0))
        velocity.setY(-velocity.getY());
}